

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_privileged.inc.c
# Opt level: O1

_Bool trans_mret(DisasContext_conflict12 *ctx,arg_mret *a)

{
  TCGContext_conflict11 *tcg_ctx;
  undefined1 extraout_AL;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),
                      (ctx->base).pc_next);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGTemp *)(tcg_ctx->cpu_pc + (long)tcg_ctx);
  tcg_gen_callN_riscv64(tcg_ctx,helper_mret_riscv64,local_20,2,&local_28);
  exit_tb(ctx);
  (ctx->base).is_jmp = DISAS_NORETURN;
  return (_Bool)extraout_AL;
}

Assistant:

static bool trans_mret(DisasContext *ctx, arg_mret *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);
    gen_helper_mret(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->cpu_env, tcg_ctx->cpu_pc);
    exit_tb(ctx); /* no chaining */
    ctx->base.is_jmp = DISAS_NORETURN;
    return true;
}